

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O0

unsigned_short argagg::convert::long_<unsigned_short>(char *arg)

{
  int *piVar1;
  long lVar2;
  ostream *poVar3;
  invalid_argument *this;
  out_of_range *this_00;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream msg;
  char *pcStack_18;
  unsigned_short ret;
  char *endptr;
  char *arg_local;
  
  pcStack_18 = (char *)0x0;
  endptr = arg;
  piVar1 = __errno_location();
  *piVar1 = 0;
  lVar2 = strtol(endptr,&stack0xffffffffffffffe8,0);
  msg._374_2_ = SUB82(lVar2,0);
  if (pcStack_18 == endptr) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,"unable to convert argument to integer: \"");
    poVar3 = std::operator<<(poVar3,endptr);
    std::operator<<(poVar3,"\"");
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this,local_1c8);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar1 = __errno_location();
  if (*piVar1 == 0x22) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"argument numeric value out of range");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  return msg._374_2_;
}

Assistant:

inline
  T long_(const char* arg)
  {
    char* endptr = nullptr;
    errno = 0;
    T ret = static_cast<T>(std::strtol(arg, &endptr, 0));
    if (endptr == arg) {
      std::ostringstream msg;
      msg << "unable to convert argument to integer: \"" << arg << "\"";
      throw std::invalid_argument(msg.str());
    }
    if (errno == ERANGE) {
      throw std::out_of_range("argument numeric value out of range");
    }
    return ret;
  }